

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_stack_check(ASMState *as,BCReg topslot,IRIns *irp,RegSet allow,ExitNo exitno)

{
  uint uVar1;
  char cVar2;
  MCode *pMVar3;
  Reg rb;
  ulong uVar4;
  uint uVar5;
  
  if (irp == (IRIns *)0x0) {
    uVar5 = 2;
  }
  else {
    uVar5 = (uint)(irp->field_1).r;
  }
  uVar1 = 0;
  if (allow != 0) {
    for (; (allow >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
    }
  }
  pMVar3 = as->mcp;
  *(ExitNo *)(pMVar3 + -4) =
       ((exitno & 0x1f) * 4 + *(int *)(as->J->exitstubgroup + (exitno >> 5))) - (int)pMVar3;
  pMVar3[-6] = '\x0f';
  pMVar3[-5] = 0x82;
  as->mcp = pMVar3 + -6;
  uVar4 = (ulong)uVar1;
  if (allow == 0) {
    uVar4 = 0;
    pMVar3[-10] = 'H';
    pMVar3[-9] = 0x8b;
    pMVar3[-8] = '\x04';
    pMVar3[-7] = '$';
    as->mcp = pMVar3 + -10;
  }
  else {
    as->modset = as->modset | 1 << ((byte)uVar1 & 0x1f);
  }
  rb = (Reg)uVar4;
  emit_gri(as,0x838107,rb,topslot << 3);
  cVar2 = (char)uVar4;
  if (uVar5 == rb || 0x7f < uVar5) {
    pMVar3 = as->mcp;
    *(int *)(pMVar3 + -4) = *(int *)&as->J + -0xb8;
    pMVar3[-5] = '%';
    pMVar3[-6] = cVar2 * '\b' & 0x38U | 4;
    pMVar3[-7] = '+';
    if ((uVar4 & 8) == 0) {
      pMVar3 = pMVar3 + -7;
    }
    else {
      pMVar3[-8] = 'D';
      pMVar3 = pMVar3 + -8;
    }
  }
  else {
    pMVar3 = as->mcp;
    pMVar3[-1] = ((byte)uVar5 & 7) + cVar2 * '\b' | 0xc0;
    pMVar3[-2] = '+';
    uVar5 = uVar5 >> 3 & 1 | (uint)(uVar4 >> 1) & 4;
    if (uVar5 == 0) {
      pMVar3 = pMVar3 + -2;
    }
    else {
      pMVar3[-3] = (byte)uVar5 | 0x40;
      pMVar3 = pMVar3 + -3;
    }
  }
  as->mcp = pMVar3;
  emit_rmro(as,XO_MOV,rb,rb,0x20);
  pMVar3 = as->mcp;
  *(int *)(pMVar3 + -4) = *(int *)&as->J + -0xc0;
  pMVar3[-5] = '%';
  pMVar3[-6] = cVar2 * '\b' & 0x38U | 4;
  pMVar3[-7] = 0x8b;
  if ((uVar4 & 8) == 0) {
    pMVar3 = pMVar3 + -7;
  }
  else {
    pMVar3[-8] = 'D';
    pMVar3 = pMVar3 + -8;
  }
  as->mcp = pMVar3;
  if (allow == 0) {
    pMVar3[-4] = 'H';
    pMVar3[-3] = 0x89;
    pMVar3[-2] = '\x04';
    pMVar3[-1] = '$';
    as->mcp = pMVar3 + -4;
  }
  return;
}

Assistant:

static void asm_stack_check(ASMState *as, BCReg topslot,
			    IRIns *irp, RegSet allow, ExitNo exitno)
{
  /* Try to get an unused temp. register, otherwise spill/restore eax. */
  Reg pbase = irp ? irp->r : RID_BASE;
  Reg r = allow ? rset_pickbot(allow) : RID_EAX;
  emit_jcc(as, CC_B, exitstub_addr(as->J, exitno));
  if (allow == RSET_EMPTY)  /* Restore temp. register. */
    emit_rmro(as, XO_MOV, r|REX_64, RID_ESP, 0);
  else
    ra_modified(as, r);
  emit_gri(as, XG_ARITHi(XOg_CMP), r|REX_GC64, (int32_t)(8*topslot));
  if (ra_hasreg(pbase) && pbase != r)
    emit_rr(as, XO_ARITH(XOg_SUB), r|REX_GC64, pbase);
  else
#if LJ_GC64
    emit_rmro(as, XO_ARITH(XOg_SUB), r|REX_64, RID_DISPATCH,
	      (int32_t)dispofs(as, &J2G(as->J)->jit_base));
#else
    emit_rmro(as, XO_ARITH(XOg_SUB), r, RID_NONE,
	      ptr2addr(&J2G(as->J)->jit_base));
#endif
  emit_rmro(as, XO_MOV, r|REX_GC64, r, offsetof(lua_State, maxstack));
  emit_getgl(as, r, cur_L);
  if (allow == RSET_EMPTY)  /* Spill temp. register. */
    emit_rmro(as, XO_MOVto, r|REX_64, RID_ESP, 0);
}